

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_memusage.h
# Opt level: O0

size_t RecursiveDynamicUsage(CTransaction *tx)

{
  long lVar1;
  bool bVar2;
  vector<CTxIn,_std::allocator<CTxIn>_> *this;
  size_t sVar3;
  long in_FS_OFFSET;
  size_t mem;
  const_iterator it_1;
  const_iterator it;
  CTxOut *in_stack_ffffffffffffffa8;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
  in_stack_ffffffffffffffb8;
  CTxIn *in;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (vector<CTxIn,_std::allocator<CTxIn>_> *)
         memusage::DynamicUsage<CTxIn>
                   ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffffa8);
  sVar3 = memusage::DynamicUsage<CTxOut>
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffffa8);
  in = (CTxIn *)((long)&(this->super__Vector_base<CTxIn,_std::allocator<CTxIn>_>)._M_impl.
                        super__Vector_impl_data._M_start + sVar3);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin(this);
  while( true ) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::end(this);
    bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_stack_ffffffffffffffb8._M_current,
                       (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)this);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
              in_stack_ffffffffffffffa8);
    sVar3 = RecursiveDynamicUsage(in);
    in = (CTxIn *)((in->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + sVar3);
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_stack_ffffffffffffffb8._M_current,(int)((ulong)this >> 0x20));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)this);
  while( true ) {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::end
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)this);
    bVar2 = __gnu_cxx::operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)in_stack_ffffffffffffffb8._M_current,
                       (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)this);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> *)
              in_stack_ffffffffffffffa8);
    sVar3 = RecursiveDynamicUsage(in_stack_ffffffffffffffa8);
    in = (CTxIn *)((in->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + sVar3);
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
         ::operator++(in_stack_ffffffffffffffb8._M_current,(int)((ulong)this >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (size_t)in;
  }
  __stack_chk_fail();
}

Assistant:

static inline size_t RecursiveDynamicUsage(const CTransaction& tx) {
    size_t mem = memusage::DynamicUsage(tx.vin) + memusage::DynamicUsage(tx.vout);
    for (std::vector<CTxIn>::const_iterator it = tx.vin.begin(); it != tx.vin.end(); it++) {
        mem += RecursiveDynamicUsage(*it);
    }
    for (std::vector<CTxOut>::const_iterator it = tx.vout.begin(); it != tx.vout.end(); it++) {
        mem += RecursiveDynamicUsage(*it);
    }
    return mem;
}